

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

void __thiscall
icu_63::FixedDecimal::FixedDecimal(FixedDecimal *this,UnicodeString *num,UErrorCode *status)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  int32_t length;
  double n;
  StringPiece n_00;
  CharString cs;
  DecimalQuantity dl;
  CharString local_b0;
  DecimalQuantity local_70;
  
  (this->super_IFixedDecimal)._vptr_IFixedDecimal = (_func_int **)&PTR__FixedDecimal_003b7c60;
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__FixedDecimal_003b7ca0;
  MaybeStackArray<char,_40>::MaybeStackArray(&local_b0.buffer);
  local_b0.len = 0;
  *local_b0.buffer.ptr = '\0';
  CharString::appendInvariantChars(&local_b0,num,status);
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&local_70);
  n_00.length_ = local_b0.len;
  n_00.ptr_ = local_b0.buffer.ptr;
  n_00._12_4_ = 0;
  icu_63::number::impl::DecimalQuantity::setToDecNumber(&local_70,n_00,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = (num->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      length = (num->fUnion).fFields.fLength;
    }
    else {
      length = (int)sVar1 >> 5;
    }
    uVar2 = UnicodeString::doIndexOf(num,L'.',0,length);
    n = icu_63::number::impl::DecimalQuantity::toDouble(&local_70);
    if (uVar2 == 0xffffffff) {
      init(this,(EVP_PKEY_CTX *)0x0);
    }
    else {
      sVar1 = (num->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (num->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      getFractionalDigits(n,~uVar2 + iVar3);
      init(this,(EVP_PKEY_CTX *)(ulong)(~uVar2 + iVar3));
    }
  }
  else {
    init(this,(EVP_PKEY_CTX *)0x0);
  }
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&local_70);
  MaybeStackArray<char,_40>::~MaybeStackArray(&local_b0.buffer);
  return;
}

Assistant:

FixedDecimal::FixedDecimal(const UnicodeString &num, UErrorCode &status) {
    CharString cs;
    cs.appendInvariantChars(num, status);
    DecimalQuantity dl;
    dl.setToDecNumber(cs.toStringPiece(), status);
    if (U_FAILURE(status)) {
        init(0, 0, 0);
        return;
    }
    int32_t decimalPoint = num.indexOf(DOT);
    double n = dl.toDouble();
    if (decimalPoint == -1) {
        init(n, 0, 0);
    } else {
        int32_t v = num.length() - decimalPoint - 1;
        init(n, v, getFractionalDigits(n, v));
    }
}